

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void __thiscall FBehavior::LoadScriptsDirectory(FBehavior *this)

{
  uint *puVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *puVar10;
  char *pcVar11;
  ScriptPtr *pSVar12;
  ulong uVar13;
  ScriptPtr *local_158;
  ScriptPtr *local_110;
  ScriptPtr *local_c8;
  FName local_94;
  BYTE *pBStack_90;
  FName name;
  char *str;
  ScriptPtr *ptr_2;
  int script_num;
  int size;
  ScriptPtr *ptr_1;
  ScriptPtr *ptr;
  ScriptPtr *local_60;
  ScriptPtr *ptr2_2;
  ScriptPtr3 *ptr1_2;
  ScriptPtr *ptr2_1;
  ScriptPtr1 *ptr1_1;
  ScriptPtr *ptr2;
  ScriptPtr2 *ptr1;
  uint local_20;
  uint local_1c;
  int max;
  int i;
  anon_union_8_7_ca4f4fff scripts;
  FBehavior *this_local;
  
  this->NumScripts = 0;
  this->Scripts = (ScriptPtr *)0x0;
  scripts = (anon_union_8_7_ca4f4fff)this;
  if (this->Format == ACS_Old) {
    _max = (int *)(this->Data + *(uint *)(this->Data + 4));
    this->NumScripts = *_max;
    if (this->NumScripts != 0) {
      _max = _max + 1;
      uVar8 = (ulong)this->NumScripts;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar8;
      uVar9 = SUB168(auVar4 * ZEXT816(0x38),0);
      uVar13 = uVar9 + 8;
      if (SUB168(auVar4 * ZEXT816(0x38),8) != 0 || 0xfffffffffffffff7 < uVar9) {
        uVar13 = 0xffffffffffffffff;
      }
      puVar10 = (ulong *)operator_new__(uVar13);
      *puVar10 = uVar8;
      pSVar12 = (ScriptPtr *)(puVar10 + 1);
      if (uVar8 != 0) {
        local_c8 = pSVar12;
        do {
          ScriptPtr::ScriptPtr(local_c8);
          local_c8 = local_c8 + 1;
        } while (local_c8 != pSVar12 + uVar8);
      }
      this->Scripts = pSVar12;
      for (local_1c = 0; (int)local_1c < this->NumScripts; local_1c = local_1c + 1) {
        ptr2 = (ScriptPtr *)(_max + (long)(int)local_1c * 3);
        ptr1_1 = (ScriptPtr1 *)(this->Scripts + (int)local_1c);
        ((ScriptPtr *)ptr1_1)->Number = (uint)ptr2->Number % 1000;
        ((ScriptPtr *)ptr1_1)->Type = (BYTE)((ulong)(uint)ptr2->Number / 1000);
        uVar2 = ptr2->Type;
        ((ScriptPtr *)ptr1_1)->ArgCount = uVar2;
        ((ScriptPtr *)ptr1_1)->Address = ptr2->Address;
      }
    }
  }
  else if (this->Format - ACS_Enhanced < 2) {
    _max = (int *)FindChunk(this,0x52545053);
    if (_max == (int *)0x0) {
      _max = (int *)0x0;
    }
    else if (*(int *)this->Data == 0x534341) {
      this->NumScripts = *(uint *)((long)_max + 4) >> 3;
      uVar8 = (ulong)this->NumScripts;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar8;
      uVar9 = SUB168(auVar6 * ZEXT816(0x38),0);
      uVar13 = uVar9 + 8;
      if (SUB168(auVar6 * ZEXT816(0x38),8) != 0 || 0xfffffffffffffff7 < uVar9) {
        uVar13 = 0xffffffffffffffff;
      }
      puVar10 = (ulong *)operator_new__(uVar13);
      *puVar10 = uVar8;
      pSVar12 = (ScriptPtr *)(puVar10 + 1);
      if (uVar8 != 0) {
        local_158 = pSVar12;
        do {
          ScriptPtr::ScriptPtr(local_158);
          local_158 = local_158 + 1;
        } while (local_158 != pSVar12 + uVar8);
      }
      this->Scripts = pSVar12;
      _max = (int *)((long)_max + 8);
      for (local_1c = 0; (int)local_1c < this->NumScripts; local_1c = local_1c + 1) {
        ptr2_2 = (ScriptPtr *)(_max + (long)(int)local_1c * 2);
        local_60 = this->Scripts + (int)local_1c;
        local_60->Number = (int)(short)ptr2_2->Number;
        local_60->Type = *(BYTE *)((long)&ptr2_2->Number + 2);
        local_60->ArgCount = *(BYTE *)((long)&ptr2_2->Number + 3);
        local_60->Address = ptr2_2->Address;
      }
    }
    else {
      this->NumScripts = *(uint *)((long)_max + 4) / 0xc;
      uVar8 = (ulong)this->NumScripts;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar8;
      uVar9 = SUB168(auVar5 * ZEXT816(0x38),0);
      uVar13 = uVar9 + 8;
      if (SUB168(auVar5 * ZEXT816(0x38),8) != 0 || 0xfffffffffffffff7 < uVar9) {
        uVar13 = 0xffffffffffffffff;
      }
      puVar10 = (ulong *)operator_new__(uVar13);
      *puVar10 = uVar8;
      pSVar12 = (ScriptPtr *)(puVar10 + 1);
      if (uVar8 != 0) {
        local_110 = pSVar12;
        do {
          ScriptPtr::ScriptPtr(local_110);
          local_110 = local_110 + 1;
        } while (local_110 != pSVar12 + uVar8);
      }
      this->Scripts = pSVar12;
      _max = (int *)((long)_max + 8);
      for (local_1c = 0; (int)local_1c < this->NumScripts; local_1c = local_1c + 1) {
        ptr2_1 = (ScriptPtr *)(_max + (long)(int)local_1c * 3);
        ptr1_2 = (ScriptPtr3 *)(this->Scripts + (int)local_1c);
        ((ScriptPtr *)ptr1_2)->Number = (int)(short)ptr2_1->Number;
        ((ScriptPtr *)ptr1_2)->Type = (BYTE)*(undefined2 *)((long)&ptr2_1->Number + 2);
        uVar3 = ptr2_1->Type;
        ((ScriptPtr *)ptr1_2)->ArgCount = uVar3;
        ((ScriptPtr *)ptr1_2)->Address = ptr2_1->Address;
      }
    }
  }
  for (local_1c = 0; (int)local_1c < this->NumScripts; local_1c = local_1c + 1) {
    this->Scripts[(int)local_1c].Flags = 0;
    this->Scripts[(int)local_1c].VarCount = 0x14;
  }
  if ((1 < this->NumScripts) &&
     (qsort(this->Scripts,(long)this->NumScripts,0x38,SortScripts), this->Format == ACS_Old)) {
    for (local_1c = 0; (int)local_1c < this->NumScripts + -1; local_1c = local_1c + 1) {
      if (this->Scripts[(int)local_1c].Number == this->Scripts[(int)(local_1c + 1)].Number) {
        ScriptPresentation((int)(FString *)&ptr);
        pcVar11 = FString::GetChars((FString *)&ptr);
        Printf("\x1cI%s appears more than once.\n",pcVar11);
        FString::~FString((FString *)&ptr);
        if (this->Scripts[(int)(local_1c + 1)].Type == '\0') {
          swapvalues<ScriptPtr>(this->Scripts + (int)local_1c,this->Scripts + (int)(local_1c + 1));
        }
      }
    }
  }
  if (this->Format != ACS_Old) {
    _max = (int *)FindChunk(this,0x474c4653);
    if (_max != (int *)0x0) {
      puVar1 = (uint *)((long)_max + 4);
      _max = (int *)((long)_max + 8);
      local_20 = *puVar1 >> 2;
      for (local_1c = local_20; 0 < (int)local_1c; local_1c = local_1c - 1) {
        pSVar12 = FindScript(this,(int)*(short *)_max);
        if (pSVar12 != (ScriptPtr *)0x0) {
          pSVar12->Flags = *(WORD *)((long)_max + 2);
        }
        _max = (int *)((long)_max + 4);
      }
    }
    _max = (int *)FindChunk(this,0x54435653);
    if (_max != (int *)0x0) {
      puVar1 = (uint *)((long)_max + 4);
      _max = (int *)((long)_max + 8);
      local_20 = *puVar1 >> 2;
      for (local_1c = local_20; 0 < (int)local_1c; local_1c = local_1c - 1) {
        pSVar12 = FindScript(this,(int)*(short *)_max);
        if (pSVar12 != (ScriptPtr *)0x0) {
          pSVar12->VarCount = *(WORD *)((long)_max + 2);
        }
        _max = (int *)((long)_max + 4);
      }
    }
    for (_max = (int *)FindChunk(this,0x59524153); _max != (int *)0x0;
        _max = (int *)NextChunk(this,(BYTE *)_max)) {
      if ((5 < *(int *)((long)_max + 4)) &&
         (pSVar12 = FindScript(this,(int)*(short *)((long)_max + 8)), pSVar12 != (ScriptPtr *)0x0))
      {
        iVar7 = ParseLocalArrayChunk(_max,&pSVar12->LocalArrays,(uint)pSVar12->VarCount);
        pSVar12->VarCount = (WORD)iVar7;
      }
    }
    _max = (int *)FindChunk(this,0x4d414e53);
    if (_max != (int *)0x0) {
      UnescapeStringTable(this,(BYTE *)((long)_max + 8),(BYTE *)0x0,false);
      for (local_1c = 0; (int)local_1c < this->NumScripts; local_1c = local_1c + 1) {
        if (this->Scripts[(int)local_1c].Number < 0) {
          pBStack_90 = (BYTE *)((long)_max +
                               (ulong)*(uint *)((long)_max +
                                               (long)(2 - this->Scripts[(int)local_1c].Number) * 4)
                               + 8);
          FName::FName(&local_94,(char *)pBStack_90);
          iVar7 = FName::operator_cast_to_int(&local_94);
          this->Scripts[(int)local_1c].Number = -iVar7;
        }
      }
      qsort(this->Scripts,(long)this->NumScripts,0x38,SortScripts);
    }
  }
  return;
}

Assistant:

void FBehavior::LoadScriptsDirectory ()
{
	union
	{
		BYTE *b;
		DWORD *dw;
		WORD *w;
		SWORD *sw;
		ScriptPtr2 *po;		// Old
		ScriptPtr1 *pi;		// Intermediate
		ScriptPtr3 *pe;		// LittleEnhanced
	} scripts;
	int i, max;

	NumScripts = 0;
	Scripts = NULL;

	// Load the main script directory
	switch (Format)
	{
	case ACS_Old:
		scripts.dw = (DWORD *)(Data + LittleLong(((DWORD *)Data)[1]));
		NumScripts = LittleLong(scripts.dw[0]);
		if (NumScripts != 0)
		{
			scripts.dw++;

			Scripts = new ScriptPtr[NumScripts];

			for (i = 0; i < NumScripts; ++i)
			{
				ScriptPtr2 *ptr1 = &scripts.po[i];
				ScriptPtr  *ptr2 = &Scripts[i];

				ptr2->Number = LittleLong(ptr1->Number) % 1000;
				ptr2->Type = LittleLong(ptr1->Number) / 1000;
				ptr2->ArgCount = LittleLong(ptr1->ArgCount);
				ptr2->Address = LittleLong(ptr1->Address);
			}
		}
		break;

	case ACS_Enhanced:
	case ACS_LittleEnhanced:
		scripts.b = FindChunk (MAKE_ID('S','P','T','R'));
		if (scripts.b == NULL)
		{
			// There are no scripts!
		}
		else if (*(DWORD *)Data != MAKE_ID('A','C','S',0))
		{
			NumScripts = LittleLong(scripts.dw[1]) / 12;
			Scripts = new ScriptPtr[NumScripts];
			scripts.dw += 2;

			for (i = 0; i < NumScripts; ++i)
			{
				ScriptPtr1 *ptr1 = &scripts.pi[i];
				ScriptPtr  *ptr2 = &Scripts[i];

				ptr2->Number = LittleShort(ptr1->Number);
				ptr2->Type = BYTE(LittleShort(ptr1->Type));
				ptr2->ArgCount = LittleLong(ptr1->ArgCount);
				ptr2->Address = LittleLong(ptr1->Address);
			}
		}
		else
		{
			NumScripts = LittleLong(scripts.dw[1]) / 8;
			Scripts = new ScriptPtr[NumScripts];
			scripts.dw += 2;

			for (i = 0; i < NumScripts; ++i)
			{
				ScriptPtr3 *ptr1 = &scripts.pe[i];
				ScriptPtr  *ptr2 = &Scripts[i];

				ptr2->Number = LittleShort(ptr1->Number);
				ptr2->Type = ptr1->Type;
				ptr2->ArgCount = ptr1->ArgCount;
				ptr2->Address = LittleLong(ptr1->Address);
			}
		}
		break;

	default:
		break;
	}

// [EP] Clang 3.5.0 optimizer miscompiles this function and causes random
// crashes in the program. This is fixed in 3.5.1 onwards.
#if defined(__clang__) && __clang_major__ == 3 && __clang_minor__ == 5 && __clang_patchlevel__ == 0
	asm("" : "+g" (NumScripts));
#endif
	for (i = 0; i < NumScripts; ++i)
	{
		Scripts[i].Flags = 0;
		Scripts[i].VarCount = LOCAL_SIZE;
	}

	// Sort scripts, so we can use a binary search to find them
	if (NumScripts > 1)
	{
		qsort (Scripts, NumScripts, sizeof(ScriptPtr), SortScripts);
		// Check for duplicates because ACC originally did not enforce
		// script number uniqueness across different script types. We
		// only need to do this for old format lumps, because the ACCs
		// that produce new format lumps won't let you do this.
		if (Format == ACS_Old)
		{
			for (i = 0; i < NumScripts - 1; ++i)
			{
				if (Scripts[i].Number == Scripts[i+1].Number)
				{
					Printf(TEXTCOLOR_ORANGE "%s appears more than once.\n",
						ScriptPresentation(Scripts[i].Number).GetChars());
					// Make the closed version the first one.
					if (Scripts[i+1].Type == SCRIPT_Closed)
					{
						swapvalues(Scripts[i], Scripts[i+1]);
					}
				}
			}
		}
	}

	if (Format == ACS_Old)
		return;

	// Load script flags
	scripts.b = FindChunk (MAKE_ID('S','F','L','G'));
	if (scripts.dw != NULL)
	{
		max = LittleLong(scripts.dw[1]) / 4;
		scripts.dw += 2;
		for (i = max; i > 0; --i, scripts.w += 2)
		{
			ScriptPtr *ptr = const_cast<ScriptPtr *>(FindScript (LittleShort(scripts.sw[0])));
			if (ptr != NULL)
			{
				ptr->Flags = LittleShort(scripts.w[1]);
			}
		}
	}

	// Load script var counts. (Only recorded for scripts that use more than LOCAL_SIZE variables.)
	scripts.b = FindChunk (MAKE_ID('S','V','C','T'));
	if (scripts.dw != NULL)
	{
		max = LittleLong(scripts.dw[1]) / 4;
		scripts.dw += 2;
		for (i = max; i > 0; --i, scripts.w += 2)
		{
			ScriptPtr *ptr = const_cast<ScriptPtr *>(FindScript (LittleShort(scripts.sw[0])));
			if (ptr != NULL)
			{
				ptr->VarCount = LittleShort(scripts.w[1]);
			}
		}
	}

	// Load script array sizes. (One chunk per script that uses arrays.)
	for (scripts.b = FindChunk(MAKE_ID('S','A','R','Y')); scripts.dw != NULL; scripts.b = NextChunk(scripts.b))
	{
		int size = LittleLong(scripts.dw[1]);
		if (size >= 6)
		{
			int script_num = LittleShort(scripts.sw[4]);
			ScriptPtr *ptr = const_cast<ScriptPtr *>(FindScript(script_num));
			if (ptr != NULL)
			{
				ptr->VarCount = ParseLocalArrayChunk(scripts.b, &ptr->LocalArrays, ptr->VarCount);
			}
		}
	}

	// Load script names (if any)
	scripts.b = FindChunk(MAKE_ID('S','N','A','M'));
	if (scripts.dw != NULL)
	{
		UnescapeStringTable(scripts.b + 8, NULL, false);
		for (i = 0; i < NumScripts; ++i)
		{
			// ACC stores script names as an index into the SNAM chunk, with the first index as
			// -1 and counting down from there. We convert this from an index into SNAM into
			// a negative index into the global name table.
			if (Scripts[i].Number < 0)
			{
				const char *str = (const char *)(scripts.b + 8 + scripts.dw[3 + (-Scripts[i].Number - 1)]);
				FName name(str);
				Scripts[i].Number = -name;
			}
		}
		// We need to resort scripts, because the new numbers for named scripts likely
		// do not match the order they were originally in.
		qsort (Scripts, NumScripts, sizeof(ScriptPtr), SortScripts);
	}
}